

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_debugnames.c
# Opt level: O0

int read_uword_val(Dwarf_Debug dbg,Dwarf_Small **ptr_in,Dwarf_Small *endptr,int errcode,
                  Dwarf_Unsigned *val_out,Dwarf_Unsigned area_length,Dwarf_Error *error)

{
  Dwarf_Byte_Ptr readend;
  Dwarf_Unsigned _ltmp;
  Dwarf_Small *ptr;
  Dwarf_Unsigned val;
  Dwarf_Unsigned area_length_local;
  Dwarf_Unsigned *val_out_local;
  Dwarf_Small *pDStack_28;
  int errcode_local;
  Dwarf_Small *endptr_local;
  Dwarf_Small **ptr_in_local;
  Dwarf_Debug dbg_local;
  
  ptr = (Dwarf_Small *)0x0;
  _ltmp = (Dwarf_Unsigned)*ptr_in;
  readend = (Dwarf_Byte_Ptr)0x0;
  val = area_length;
  area_length_local = (Dwarf_Unsigned)val_out;
  val_out_local._4_4_ = errcode;
  pDStack_28 = endptr;
  endptr_local = (Dwarf_Small *)ptr_in;
  ptr_in_local = (Dwarf_Small **)dbg;
  if ((Dwarf_Small *)(_ltmp + 4) < _ltmp) {
    _dwarf_error_string(dbg,error,0x14b,
                        "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
    dbg_local._4_4_ = 1;
  }
  else if (endptr < (Dwarf_Small *)(_ltmp + 4)) {
    _dwarf_error_string(dbg,error,0x14b,
                        "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
    dbg_local._4_4_ = 1;
  }
  else {
    (*dbg->de_copy_word)(&readend,(void *)_ltmp,4);
    ptr = readend;
    _ltmp = _ltmp + 4;
    if (_ltmp < pDStack_28) {
      if (val < readend) {
        _dwarf_error((Dwarf_Debug)ptr_in_local,error,(long)val_out_local._4_4_);
        dbg_local._4_4_ = 1;
      }
      else {
        *(Dwarf_Byte_Ptr *)area_length_local = readend;
        *(Dwarf_Unsigned *)endptr_local = _ltmp;
        dbg_local._4_4_ = 0;
      }
    }
    else {
      _dwarf_error((Dwarf_Debug)ptr_in_local,error,(long)val_out_local._4_4_);
      dbg_local._4_4_ = 1;
    }
  }
  return dbg_local._4_4_;
}

Assistant:

static int
read_uword_val(Dwarf_Debug dbg,
    Dwarf_Small **ptr_in,
    Dwarf_Small *endptr,
    int   errcode,
    Dwarf_Unsigned *val_out,
    Dwarf_Unsigned area_length,
    Dwarf_Error *error)
{
    Dwarf_Unsigned val = 0;
    Dwarf_Small *ptr = *ptr_in;

    READ_UNALIGNED_CK(dbg, val, Dwarf_Unsigned,
        ptr, DWARF_32BIT_SIZE,
        error,endptr);
    ptr += DWARF_32BIT_SIZE;
    if (ptr >= endptr) {
        _dwarf_error(dbg, error,errcode);
        return DW_DLV_ERROR;
    }
    /*  Some of the fields are not length fields, but
        if non-zero the size will be longer than
        the value, so we do the following
        overall sanity check to avoid overflows. */
    if (val > area_length) {
        _dwarf_error(dbg, error,errcode);
        return DW_DLV_ERROR;
    }
    *val_out = val;
    *ptr_in = ptr;
    return DW_DLV_OK;
}